

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O1

void __thiscall
CRenderTools::SelectSprite(CRenderTools *this,CDataSprite *pSpr,int Flags,int sx,int sy)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  iVar1 = pSpr->m_X;
  iVar2 = pSpr->m_W;
  iVar3 = pSpr->m_H;
  iVar4 = pSpr->m_pSet->m_Gridx;
  iVar5 = pSpr->m_pSet->m_Gridy;
  fVar7 = (float)(iVar2 * iVar2 + iVar3 * iVar3);
  iVar6 = pSpr->m_Y;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    fVar7 = SQRT(fVar7);
  }
  gs_SpriteWScale = (float)iVar2 / fVar7;
  gs_SpriteHScale = (float)iVar3 / fVar7;
  auVar10._0_4_ = (float)iVar4;
  auVar10._4_4_ = (float)(iVar4 << 5);
  auVar10._8_8_ = 0;
  auVar8._4_4_ = 0x3f000000;
  auVar8._0_4_ = (float)(sx + iVar1);
  auVar8._8_8_ = 0;
  divps(auVar8,auVar10);
  auVar11._0_4_ = (float)iVar5;
  auVar11._4_4_ = (float)(iVar5 << 5);
  auVar11._8_8_ = 0;
  auVar9._4_4_ = 0x3f000000;
  auVar9._0_4_ = (float)(sy + iVar6);
  auVar9._8_8_ = 0;
  divps(auVar9,auVar11);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1a])(this->m_pGraphics,0xffffffff);
  return;
}

Assistant:

void CRenderTools::SelectSprite(const CDataSprite *pSpr, int Flags, int sx, int sy)
{
	int x = pSpr->m_X+sx;
	int y = pSpr->m_Y+sy;
	int w = pSpr->m_W;
	int h = pSpr->m_H;
	int cx = pSpr->m_pSet->m_Gridx;
	int cy = pSpr->m_pSet->m_Gridy;

	float f = sqrtf(h*h + w*w);
	gs_SpriteWScale = w/f;
	gs_SpriteHScale = h/f;

	float x1 = x/(float)cx + 0.5f/(float)(cx*32);
	float x2 = (x+w)/(float)cx - 0.5f/(float)(cx*32);
	float y1 = y/(float)cy + 0.5f/(float)(cy*32);
	float y2 = (y+h)/(float)cy - 0.5f/(float)(cy*32);

	if(Flags&SPRITE_FLAG_FLIP_Y)
		std::swap(y1, y2);

	if(Flags&SPRITE_FLAG_FLIP_X)
		std::swap(x1, x2);

	Graphics()->QuadsSetSubset(x1, y1, x2, y2);
}